

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CEditor::DoMapBorder(CEditor *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  CLayer *pCVar48;
  uint uVar49;
  ulong uVar50;
  int in_ESI;
  long lVar51;
  long lVar52;
  uint uVar53;
  int iVar54;
  long lVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar67;
  int iVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  long lVar68;
  undefined1 auVar66 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  int iVar108;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  int iVar135;
  int iVar136;
  int iVar143;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  long lVar90;
  
  pCVar48 = GetSelectedLayer(this,in_ESI);
  auVar47 = _DAT_001d6390;
  iVar54 = *(int *)((long)&pCVar48[1].m_pEditor + 4);
  if (0 < iVar54) {
    uVar50 = 1;
    if (1 < iVar54 * 2) {
      uVar50 = (ulong)(uint)(iVar54 * 2);
    }
    lVar52 = *(long *)(pCVar48[2].m_aName + 8);
    lVar51 = uVar50 - 1;
    auVar56._8_4_ = (int)lVar51;
    auVar56._0_8_ = lVar51;
    auVar56._12_4_ = (int)((ulong)lVar51 >> 0x20);
    lVar51 = 0;
    auVar57 = auVar56;
    auVar70 = _DAT_001d9cb0;
    auVar80 = _DAT_001d9cc0;
    auVar89 = _DAT_001d9cd0;
    auVar91 = _DAT_001d9ce0;
    auVar92 = _DAT_001d9cf0;
    auVar106 = _DAT_001d9d00;
    auVar122 = _DAT_001d9d10;
    auVar81 = _DAT_001d6f30;
    do {
      auVar104 = auVar56 ^ auVar47;
      auVar109 = auVar81 ^ auVar47;
      iVar67 = auVar104._0_4_;
      iVar135 = -(uint)(iVar67 < auVar109._0_4_);
      iVar69 = auVar104._4_4_;
      auVar111._4_4_ = -(uint)(iVar69 < auVar109._4_4_);
      iVar108 = auVar104._8_4_;
      iVar143 = -(uint)(iVar108 < auVar109._8_4_);
      iVar136 = auVar104._12_4_;
      auVar111._12_4_ = -(uint)(iVar136 < auVar109._12_4_);
      auVar104._4_4_ = iVar135;
      auVar104._0_4_ = iVar135;
      auVar104._8_4_ = iVar143;
      auVar104._12_4_ = iVar143;
      auVar104 = pshuflw(auVar57,auVar104,0xe8);
      auVar110._4_4_ = -(uint)(auVar109._4_4_ == iVar69);
      auVar110._12_4_ = -(uint)(auVar109._12_4_ == iVar136);
      auVar110._0_4_ = auVar110._4_4_;
      auVar110._8_4_ = auVar110._12_4_;
      auVar93 = pshuflw(in_XMM11,auVar110,0xe8);
      auVar111._0_4_ = auVar111._4_4_;
      auVar111._8_4_ = auVar111._12_4_;
      auVar109 = pshuflw(auVar104,auVar111,0xe8);
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar57 = (auVar109 | auVar93 & auVar104) ^ auVar57;
      auVar57 = packssdw(auVar57,auVar57);
      if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar52 + lVar51) = 1;
      }
      auVar93._4_4_ = iVar135;
      auVar93._0_4_ = iVar135;
      auVar93._8_4_ = iVar143;
      auVar93._12_4_ = iVar143;
      auVar111 = auVar110 & auVar93 | auVar111;
      auVar57 = packssdw(auVar111,auVar111);
      auVar109._8_4_ = 0xffffffff;
      auVar109._0_8_ = 0xffffffffffffffff;
      auVar109._12_4_ = 0xffffffff;
      auVar57 = packssdw(auVar57 ^ auVar109,auVar57 ^ auVar109);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57._0_4_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar52 + 4 + lVar51) = 1;
      }
      auVar57 = auVar122 ^ auVar47;
      auVar94._0_4_ = -(uint)(iVar67 < auVar57._0_4_);
      auVar94._4_4_ = -(uint)(iVar69 < auVar57._4_4_);
      auVar94._8_4_ = -(uint)(iVar108 < auVar57._8_4_);
      auVar94._12_4_ = -(uint)(iVar136 < auVar57._12_4_);
      auVar112._4_4_ = auVar94._0_4_;
      auVar112._0_4_ = auVar94._0_4_;
      auVar112._8_4_ = auVar94._8_4_;
      auVar112._12_4_ = auVar94._8_4_;
      iVar135 = -(uint)(auVar57._4_4_ == iVar69);
      iVar143 = -(uint)(auVar57._12_4_ == iVar136);
      auVar20._4_4_ = iVar135;
      auVar20._0_4_ = iVar135;
      auVar20._8_4_ = iVar143;
      auVar20._12_4_ = iVar143;
      auVar137._4_4_ = auVar94._4_4_;
      auVar137._0_4_ = auVar94._4_4_;
      auVar137._8_4_ = auVar94._12_4_;
      auVar137._12_4_ = auVar94._12_4_;
      auVar57 = auVar20 & auVar112 | auVar137;
      auVar57 = packssdw(auVar57,auVar57);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar57 = packssdw(auVar57 ^ auVar1,auVar57 ^ auVar1);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57._0_4_ >> 0x10 & 1) != 0) {
        *(undefined1 *)(lVar52 + 8 + lVar51) = 1;
      }
      auVar57 = pshufhw(auVar57,auVar112,0x84);
      auVar21._4_4_ = iVar135;
      auVar21._0_4_ = iVar135;
      auVar21._8_4_ = iVar143;
      auVar21._12_4_ = iVar143;
      auVar109 = pshufhw(auVar94,auVar21,0x84);
      auVar104 = pshufhw(auVar57,auVar137,0x84);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar58 = (auVar104 | auVar109 & auVar57) ^ auVar58;
      auVar57 = packssdw(auVar58,auVar58);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57._0_4_ >> 0x18 & 1) != 0) {
        *(undefined1 *)(lVar52 + 0xc + lVar51) = 1;
      }
      auVar57 = auVar106 ^ auVar47;
      auVar95._0_4_ = -(uint)(iVar67 < auVar57._0_4_);
      auVar95._4_4_ = -(uint)(iVar69 < auVar57._4_4_);
      auVar95._8_4_ = -(uint)(iVar108 < auVar57._8_4_);
      auVar95._12_4_ = -(uint)(iVar136 < auVar57._12_4_);
      auVar22._4_4_ = auVar95._0_4_;
      auVar22._0_4_ = auVar95._0_4_;
      auVar22._8_4_ = auVar95._8_4_;
      auVar22._12_4_ = auVar95._8_4_;
      auVar109 = pshuflw(auVar137,auVar22,0xe8);
      auVar59._0_4_ = -(uint)(auVar57._0_4_ == iVar67);
      auVar59._4_4_ = -(uint)(auVar57._4_4_ == iVar69);
      auVar59._8_4_ = -(uint)(auVar57._8_4_ == iVar108);
      auVar59._12_4_ = -(uint)(auVar57._12_4_ == iVar136);
      auVar113._4_4_ = auVar59._4_4_;
      auVar113._0_4_ = auVar59._4_4_;
      auVar113._8_4_ = auVar59._12_4_;
      auVar113._12_4_ = auVar59._12_4_;
      auVar57 = pshuflw(auVar59,auVar113,0xe8);
      auVar114._4_4_ = auVar95._4_4_;
      auVar114._0_4_ = auVar95._4_4_;
      auVar114._8_4_ = auVar95._12_4_;
      auVar114._12_4_ = auVar95._12_4_;
      auVar104 = pshuflw(auVar95,auVar114,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar57 = packssdw(auVar57 & auVar109,(auVar104 | auVar57 & auVar109) ^ auVar2);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar52 + 0x10 + lVar51) = 1;
      }
      auVar23._4_4_ = auVar95._0_4_;
      auVar23._0_4_ = auVar95._0_4_;
      auVar23._8_4_ = auVar95._8_4_;
      auVar23._12_4_ = auVar95._8_4_;
      auVar114 = auVar113 & auVar23 | auVar114;
      auVar104 = packssdw(auVar114,auVar114);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar57 = packssdw(auVar57,auVar104 ^ auVar3);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57._4_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar52 + 0x14 + lVar51) = 1;
      }
      auVar57 = auVar92 ^ auVar47;
      auVar96._0_4_ = -(uint)(iVar67 < auVar57._0_4_);
      auVar96._4_4_ = -(uint)(iVar69 < auVar57._4_4_);
      auVar96._8_4_ = -(uint)(iVar108 < auVar57._8_4_);
      auVar96._12_4_ = -(uint)(iVar136 < auVar57._12_4_);
      auVar115._4_4_ = auVar96._0_4_;
      auVar115._0_4_ = auVar96._0_4_;
      auVar115._8_4_ = auVar96._8_4_;
      auVar115._12_4_ = auVar96._8_4_;
      iVar135 = -(uint)(auVar57._4_4_ == iVar69);
      iVar143 = -(uint)(auVar57._12_4_ == iVar136);
      auVar24._4_4_ = iVar135;
      auVar24._0_4_ = iVar135;
      auVar24._8_4_ = iVar143;
      auVar24._12_4_ = iVar143;
      auVar138._4_4_ = auVar96._4_4_;
      auVar138._0_4_ = auVar96._4_4_;
      auVar138._8_4_ = auVar96._12_4_;
      auVar138._12_4_ = auVar96._12_4_;
      auVar57 = auVar24 & auVar115 | auVar138;
      auVar57 = packssdw(auVar57,auVar57);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar57 = packssdw(auVar57 ^ auVar4,auVar57 ^ auVar4);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar52 + 0x18 + lVar51) = 1;
      }
      auVar57 = pshufhw(auVar57,auVar115,0x84);
      auVar25._4_4_ = iVar135;
      auVar25._0_4_ = iVar135;
      auVar25._8_4_ = iVar143;
      auVar25._12_4_ = iVar143;
      auVar109 = pshufhw(auVar96,auVar25,0x84);
      auVar104 = pshufhw(auVar57,auVar138,0x84);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar60 = (auVar104 | auVar109 & auVar57) ^ auVar60;
      auVar57 = packssdw(auVar60,auVar60);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57._6_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar52 + 0x1c + lVar51) = 1;
      }
      auVar57 = auVar91 ^ auVar47;
      auVar97._0_4_ = -(uint)(iVar67 < auVar57._0_4_);
      auVar97._4_4_ = -(uint)(iVar69 < auVar57._4_4_);
      auVar97._8_4_ = -(uint)(iVar108 < auVar57._8_4_);
      auVar97._12_4_ = -(uint)(iVar136 < auVar57._12_4_);
      auVar26._4_4_ = auVar97._0_4_;
      auVar26._0_4_ = auVar97._0_4_;
      auVar26._8_4_ = auVar97._8_4_;
      auVar26._12_4_ = auVar97._8_4_;
      auVar109 = pshuflw(auVar138,auVar26,0xe8);
      auVar61._0_4_ = -(uint)(auVar57._0_4_ == iVar67);
      auVar61._4_4_ = -(uint)(auVar57._4_4_ == iVar69);
      auVar61._8_4_ = -(uint)(auVar57._8_4_ == iVar108);
      auVar61._12_4_ = -(uint)(auVar57._12_4_ == iVar136);
      auVar116._4_4_ = auVar61._4_4_;
      auVar116._0_4_ = auVar61._4_4_;
      auVar116._8_4_ = auVar61._12_4_;
      auVar116._12_4_ = auVar61._12_4_;
      auVar57 = pshuflw(auVar61,auVar116,0xe8);
      auVar117._4_4_ = auVar97._4_4_;
      auVar117._0_4_ = auVar97._4_4_;
      auVar117._8_4_ = auVar97._12_4_;
      auVar117._12_4_ = auVar97._12_4_;
      auVar104 = pshuflw(auVar97,auVar117,0xe8);
      auVar98._8_4_ = 0xffffffff;
      auVar98._0_8_ = 0xffffffffffffffff;
      auVar98._12_4_ = 0xffffffff;
      auVar98 = (auVar104 | auVar57 & auVar109) ^ auVar98;
      auVar104 = packssdw(auVar98,auVar98);
      auVar57 = packsswb(auVar57 & auVar109,auVar104);
      if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar52 + 0x20 + lVar51) = 1;
      }
      auVar27._4_4_ = auVar97._0_4_;
      auVar27._0_4_ = auVar97._0_4_;
      auVar27._8_4_ = auVar97._8_4_;
      auVar27._12_4_ = auVar97._8_4_;
      auVar117 = auVar116 & auVar27 | auVar117;
      auVar104 = packssdw(auVar117,auVar117);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar104 = packssdw(auVar104 ^ auVar5,auVar104 ^ auVar5);
      auVar57 = packsswb(auVar57,auVar104);
      if ((auVar57._8_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar52 + 0x24 + lVar51) = 1;
      }
      auVar57 = auVar89 ^ auVar47;
      auVar99._0_4_ = -(uint)(iVar67 < auVar57._0_4_);
      auVar99._4_4_ = -(uint)(iVar69 < auVar57._4_4_);
      auVar99._8_4_ = -(uint)(iVar108 < auVar57._8_4_);
      auVar99._12_4_ = -(uint)(iVar136 < auVar57._12_4_);
      auVar118._4_4_ = auVar99._0_4_;
      auVar118._0_4_ = auVar99._0_4_;
      auVar118._8_4_ = auVar99._8_4_;
      auVar118._12_4_ = auVar99._8_4_;
      iVar135 = -(uint)(auVar57._4_4_ == iVar69);
      iVar143 = -(uint)(auVar57._12_4_ == iVar136);
      auVar28._4_4_ = iVar135;
      auVar28._0_4_ = iVar135;
      auVar28._8_4_ = iVar143;
      auVar28._12_4_ = iVar143;
      auVar139._4_4_ = auVar99._4_4_;
      auVar139._0_4_ = auVar99._4_4_;
      auVar139._8_4_ = auVar99._12_4_;
      auVar139._12_4_ = auVar99._12_4_;
      auVar57 = auVar28 & auVar118 | auVar139;
      auVar57 = packssdw(auVar57,auVar57);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar57 = packssdw(auVar57 ^ auVar6,auVar57 ^ auVar6);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar52 + 0x28 + lVar51) = 1;
      }
      auVar57 = pshufhw(auVar57,auVar118,0x84);
      auVar29._4_4_ = iVar135;
      auVar29._0_4_ = iVar135;
      auVar29._8_4_ = iVar143;
      auVar29._12_4_ = iVar143;
      auVar109 = pshufhw(auVar99,auVar29,0x84);
      auVar104 = pshufhw(auVar57,auVar139,0x84);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar62 = (auVar104 | auVar109 & auVar57) ^ auVar62;
      auVar57 = packssdw(auVar62,auVar62);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57._10_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar52 + 0x2c + lVar51) = 1;
      }
      auVar57 = auVar80 ^ auVar47;
      auVar100._0_4_ = -(uint)(iVar67 < auVar57._0_4_);
      auVar100._4_4_ = -(uint)(iVar69 < auVar57._4_4_);
      auVar100._8_4_ = -(uint)(iVar108 < auVar57._8_4_);
      auVar100._12_4_ = -(uint)(iVar136 < auVar57._12_4_);
      auVar30._4_4_ = auVar100._0_4_;
      auVar30._0_4_ = auVar100._0_4_;
      auVar30._8_4_ = auVar100._8_4_;
      auVar30._12_4_ = auVar100._8_4_;
      auVar109 = pshuflw(auVar139,auVar30,0xe8);
      auVar63._0_4_ = -(uint)(auVar57._0_4_ == iVar67);
      auVar63._4_4_ = -(uint)(auVar57._4_4_ == iVar69);
      auVar63._8_4_ = -(uint)(auVar57._8_4_ == iVar108);
      auVar63._12_4_ = -(uint)(auVar57._12_4_ == iVar136);
      auVar119._4_4_ = auVar63._4_4_;
      auVar119._0_4_ = auVar63._4_4_;
      auVar119._8_4_ = auVar63._12_4_;
      auVar119._12_4_ = auVar63._12_4_;
      auVar57 = pshuflw(auVar63,auVar119,0xe8);
      auVar120._4_4_ = auVar100._4_4_;
      auVar120._0_4_ = auVar100._4_4_;
      auVar120._8_4_ = auVar100._12_4_;
      auVar120._12_4_ = auVar100._12_4_;
      auVar104 = pshuflw(auVar100,auVar120,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar57 = packssdw(auVar57 & auVar109,(auVar104 | auVar57 & auVar109) ^ auVar7);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar52 + 0x30 + lVar51) = 1;
      }
      auVar31._4_4_ = auVar100._0_4_;
      auVar31._0_4_ = auVar100._0_4_;
      auVar31._8_4_ = auVar100._8_4_;
      auVar31._12_4_ = auVar100._8_4_;
      auVar120 = auVar119 & auVar31 | auVar120;
      auVar104 = packssdw(auVar120,auVar120);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar57 = packssdw(auVar57,auVar104 ^ auVar8);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57._12_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar52 + 0x34 + lVar51) = 1;
      }
      auVar57 = auVar70 ^ auVar47;
      auVar101._0_4_ = -(uint)(iVar67 < auVar57._0_4_);
      auVar101._4_4_ = -(uint)(iVar69 < auVar57._4_4_);
      auVar101._8_4_ = -(uint)(iVar108 < auVar57._8_4_);
      auVar101._12_4_ = -(uint)(iVar136 < auVar57._12_4_);
      auVar121._4_4_ = auVar101._0_4_;
      auVar121._0_4_ = auVar101._0_4_;
      auVar121._8_4_ = auVar101._8_4_;
      auVar121._12_4_ = auVar101._8_4_;
      iVar67 = -(uint)(auVar57._4_4_ == iVar69);
      iVar69 = -(uint)(auVar57._12_4_ == iVar136);
      auVar105._4_4_ = iVar67;
      auVar105._0_4_ = iVar67;
      auVar105._8_4_ = iVar69;
      auVar105._12_4_ = iVar69;
      auVar64._4_4_ = auVar101._4_4_;
      auVar64._0_4_ = auVar101._4_4_;
      auVar64._8_4_ = auVar101._12_4_;
      auVar64._12_4_ = auVar101._12_4_;
      auVar64 = auVar105 & auVar121 | auVar64;
      auVar57 = packssdw(auVar64,auVar64);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar57 = packssdw(auVar57 ^ auVar9,auVar57 ^ auVar9);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar52 + 0x38 + lVar51) = 1;
      }
      auVar57 = pshufhw(auVar57,auVar121,0x84);
      in_XMM11 = pshufhw(auVar101,auVar105,0x84);
      in_XMM11 = in_XMM11 & auVar57;
      auVar32._4_4_ = auVar101._4_4_;
      auVar32._0_4_ = auVar101._4_4_;
      auVar32._8_4_ = auVar101._12_4_;
      auVar32._12_4_ = auVar101._12_4_;
      auVar57 = pshufhw(auVar57,auVar32,0x84);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar65 = (auVar57 | in_XMM11) ^ auVar65;
      auVar57 = packssdw(auVar65,auVar65);
      auVar57 = packsswb(auVar57,auVar57);
      if ((auVar57._14_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar52 + 0x3c + lVar51) = 1;
      }
      lVar55 = (long)DAT_001dfc20;
      lVar90 = auVar81._8_8_;
      auVar81._0_8_ = auVar81._0_8_ + lVar55;
      lVar68 = DAT_001dfc20._8_8_;
      auVar81._8_8_ = lVar90 + lVar68;
      lVar90 = auVar122._8_8_;
      auVar122._0_8_ = auVar122._0_8_ + lVar55;
      auVar122._8_8_ = lVar90 + lVar68;
      lVar90 = auVar106._8_8_;
      auVar106._0_8_ = auVar106._0_8_ + lVar55;
      auVar106._8_8_ = lVar90 + lVar68;
      lVar90 = auVar92._8_8_;
      auVar92._0_8_ = auVar92._0_8_ + lVar55;
      auVar92._8_8_ = lVar90 + lVar68;
      lVar90 = auVar91._8_8_;
      auVar91._0_8_ = auVar91._0_8_ + lVar55;
      auVar91._8_8_ = lVar90 + lVar68;
      lVar90 = auVar89._8_8_;
      auVar89._0_8_ = auVar89._0_8_ + lVar55;
      auVar89._8_8_ = lVar90 + lVar68;
      in_XMM2._0_8_ = auVar80._0_8_ + lVar55;
      in_XMM2._8_8_ = auVar80._8_8_ + lVar68;
      in_XMM1._0_8_ = auVar70._0_8_ + lVar55;
      in_XMM1._8_8_ = auVar70._8_8_ + lVar68;
      lVar51 = lVar51 + 0x40;
      auVar57 = _DAT_001dfc20;
      auVar70 = in_XMM1;
      auVar80 = in_XMM2;
    } while ((ulong)((int)uVar50 + 0xfU & 0xfffffff0) << 2 != lVar51);
  }
  iVar67 = *(int *)pCVar48[1].m_aName;
  uVar53 = iVar67 * iVar54;
  if (0 < (int)uVar53) {
    uVar50 = 0;
    do {
      uVar49 = (uint)((long)((ulong)(uint)((int)uVar50 >> 0x1f) << 0x20 | uVar50 & 0xffffffff) %
                     (long)iVar54);
      if (iVar54 + -3 < (int)uVar49 || uVar49 < 2) {
        *(undefined1 *)(*(long *)(pCVar48[2].m_aName + 8) + uVar50 * 4) = 1;
      }
      uVar50 = uVar50 + 1;
    } while (uVar53 != uVar50);
  }
  auVar92 = _DAT_001d9d10;
  auVar91 = _DAT_001d9d00;
  auVar89 = _DAT_001d9cf0;
  auVar80 = _DAT_001d9ce0;
  auVar70 = _DAT_001d9cd0;
  auVar57 = _DAT_001d6f30;
  auVar47 = _DAT_001d6390;
  iVar54 = (iVar67 + -2) * iVar54;
  if (iVar54 < (int)uVar53) {
    lVar52 = (long)(int)uVar53 - (long)iVar54;
    lVar51 = lVar52 + -1;
    auVar66._8_4_ = (int)lVar51;
    auVar66._0_8_ = lVar51;
    auVar66._12_4_ = (int)((ulong)lVar51 >> 0x20);
    lVar51 = *(long *)(pCVar48[2].m_aName + 8) + (long)iVar54 * 4;
    uVar50 = 0;
    do {
      auVar102._8_4_ = (int)uVar50;
      auVar102._0_8_ = uVar50;
      auVar102._12_4_ = (int)(uVar50 >> 0x20);
      auVar106 = auVar66 ^ auVar47;
      auVar122 = (auVar102 | auVar57) ^ auVar47;
      iVar54 = auVar106._0_4_;
      iVar136 = -(uint)(iVar54 < auVar122._0_4_);
      iVar67 = auVar106._4_4_;
      auVar124._4_4_ = -(uint)(iVar67 < auVar122._4_4_);
      iVar69 = auVar106._8_4_;
      iVar135 = -(uint)(iVar69 < auVar122._8_4_);
      iVar108 = auVar106._12_4_;
      auVar124._12_4_ = -(uint)(iVar108 < auVar122._12_4_);
      auVar33._4_4_ = iVar136;
      auVar33._0_4_ = iVar136;
      auVar33._8_4_ = iVar135;
      auVar33._12_4_ = iVar135;
      auVar106 = pshuflw(in_XMM1,auVar33,0xe8);
      auVar123._4_4_ = -(uint)(auVar122._4_4_ == iVar67);
      auVar123._12_4_ = -(uint)(auVar122._12_4_ == iVar108);
      auVar123._0_4_ = auVar123._4_4_;
      auVar123._8_4_ = auVar123._12_4_;
      auVar81 = pshuflw(in_XMM2,auVar123,0xe8);
      auVar124._0_4_ = auVar124._4_4_;
      auVar124._8_4_ = auVar124._12_4_;
      auVar122 = pshuflw(auVar106,auVar124,0xe8);
      auVar71._8_4_ = 0xffffffff;
      auVar71._0_8_ = 0xffffffffffffffff;
      auVar71._12_4_ = 0xffffffff;
      auVar71 = (auVar122 | auVar81 & auVar106) ^ auVar71;
      auVar106 = packssdw(auVar71,auVar71);
      if ((auVar106 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar51 + uVar50 * 4) = 1;
      }
      auVar34._4_4_ = iVar136;
      auVar34._0_4_ = iVar136;
      auVar34._8_4_ = iVar135;
      auVar34._12_4_ = iVar135;
      auVar124 = auVar123 & auVar34 | auVar124;
      auVar106 = packssdw(auVar124,auVar124);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar106 = packssdw(auVar106 ^ auVar10,auVar106 ^ auVar10);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106._0_4_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar51 + 4 + uVar50 * 4) = 1;
      }
      auVar106 = (auVar102 | auVar92) ^ auVar47;
      auVar82._0_4_ = -(uint)(iVar54 < auVar106._0_4_);
      auVar82._4_4_ = -(uint)(iVar67 < auVar106._4_4_);
      auVar82._8_4_ = -(uint)(iVar69 < auVar106._8_4_);
      auVar82._12_4_ = -(uint)(iVar108 < auVar106._12_4_);
      auVar125._4_4_ = auVar82._0_4_;
      auVar125._0_4_ = auVar82._0_4_;
      auVar125._8_4_ = auVar82._8_4_;
      auVar125._12_4_ = auVar82._8_4_;
      iVar136 = -(uint)(auVar106._4_4_ == iVar67);
      iVar135 = -(uint)(auVar106._12_4_ == iVar108);
      auVar35._4_4_ = iVar136;
      auVar35._0_4_ = iVar136;
      auVar35._8_4_ = iVar135;
      auVar35._12_4_ = iVar135;
      auVar140._4_4_ = auVar82._4_4_;
      auVar140._0_4_ = auVar82._4_4_;
      auVar140._8_4_ = auVar82._12_4_;
      auVar140._12_4_ = auVar82._12_4_;
      auVar106 = auVar35 & auVar125 | auVar140;
      auVar106 = packssdw(auVar106,auVar106);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar106 = packssdw(auVar106 ^ auVar11,auVar106 ^ auVar11);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106._0_4_ >> 0x10 & 1) != 0) {
        *(undefined1 *)(lVar51 + 8 + uVar50 * 4) = 1;
      }
      auVar106 = pshufhw(auVar106,auVar125,0x84);
      auVar36._4_4_ = iVar136;
      auVar36._0_4_ = iVar136;
      auVar36._8_4_ = iVar135;
      auVar36._12_4_ = iVar135;
      auVar81 = pshufhw(auVar82,auVar36,0x84);
      auVar122 = pshufhw(auVar106,auVar140,0x84);
      auVar72._8_4_ = 0xffffffff;
      auVar72._0_8_ = 0xffffffffffffffff;
      auVar72._12_4_ = 0xffffffff;
      auVar72 = (auVar122 | auVar81 & auVar106) ^ auVar72;
      auVar106 = packssdw(auVar72,auVar72);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106._0_4_ >> 0x18 & 1) != 0) {
        *(undefined1 *)(lVar51 + 0xc + uVar50 * 4) = 1;
      }
      auVar106 = (auVar102 | auVar91) ^ auVar47;
      auVar83._0_4_ = -(uint)(iVar54 < auVar106._0_4_);
      auVar83._4_4_ = -(uint)(iVar67 < auVar106._4_4_);
      auVar83._8_4_ = -(uint)(iVar69 < auVar106._8_4_);
      auVar83._12_4_ = -(uint)(iVar108 < auVar106._12_4_);
      auVar37._4_4_ = auVar83._0_4_;
      auVar37._0_4_ = auVar83._0_4_;
      auVar37._8_4_ = auVar83._8_4_;
      auVar37._12_4_ = auVar83._8_4_;
      auVar81 = pshuflw(auVar140,auVar37,0xe8);
      auVar73._0_4_ = -(uint)(auVar106._0_4_ == iVar54);
      auVar73._4_4_ = -(uint)(auVar106._4_4_ == iVar67);
      auVar73._8_4_ = -(uint)(auVar106._8_4_ == iVar69);
      auVar73._12_4_ = -(uint)(auVar106._12_4_ == iVar108);
      auVar126._4_4_ = auVar73._4_4_;
      auVar126._0_4_ = auVar73._4_4_;
      auVar126._8_4_ = auVar73._12_4_;
      auVar126._12_4_ = auVar73._12_4_;
      auVar106 = pshuflw(auVar73,auVar126,0xe8);
      auVar127._4_4_ = auVar83._4_4_;
      auVar127._0_4_ = auVar83._4_4_;
      auVar127._8_4_ = auVar83._12_4_;
      auVar127._12_4_ = auVar83._12_4_;
      auVar122 = pshuflw(auVar83,auVar127,0xe8);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar106 = packssdw(auVar106 & auVar81,(auVar122 | auVar106 & auVar81) ^ auVar12);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar51 + 0x10 + uVar50 * 4) = 1;
      }
      auVar38._4_4_ = auVar83._0_4_;
      auVar38._0_4_ = auVar83._0_4_;
      auVar38._8_4_ = auVar83._8_4_;
      auVar38._12_4_ = auVar83._8_4_;
      auVar127 = auVar126 & auVar38 | auVar127;
      auVar122 = packssdw(auVar127,auVar127);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar106 = packssdw(auVar106,auVar122 ^ auVar13);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106._4_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar51 + 0x14 + uVar50 * 4) = 1;
      }
      auVar106 = (auVar102 | auVar89) ^ auVar47;
      auVar84._0_4_ = -(uint)(iVar54 < auVar106._0_4_);
      auVar84._4_4_ = -(uint)(iVar67 < auVar106._4_4_);
      auVar84._8_4_ = -(uint)(iVar69 < auVar106._8_4_);
      auVar84._12_4_ = -(uint)(iVar108 < auVar106._12_4_);
      auVar128._4_4_ = auVar84._0_4_;
      auVar128._0_4_ = auVar84._0_4_;
      auVar128._8_4_ = auVar84._8_4_;
      auVar128._12_4_ = auVar84._8_4_;
      iVar136 = -(uint)(auVar106._4_4_ == iVar67);
      iVar135 = -(uint)(auVar106._12_4_ == iVar108);
      auVar39._4_4_ = iVar136;
      auVar39._0_4_ = iVar136;
      auVar39._8_4_ = iVar135;
      auVar39._12_4_ = iVar135;
      auVar141._4_4_ = auVar84._4_4_;
      auVar141._0_4_ = auVar84._4_4_;
      auVar141._8_4_ = auVar84._12_4_;
      auVar141._12_4_ = auVar84._12_4_;
      auVar106 = auVar39 & auVar128 | auVar141;
      auVar106 = packssdw(auVar106,auVar106);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar106 = packssdw(auVar106 ^ auVar14,auVar106 ^ auVar14);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar51 + 0x18 + uVar50 * 4) = 1;
      }
      auVar106 = pshufhw(auVar106,auVar128,0x84);
      auVar40._4_4_ = iVar136;
      auVar40._0_4_ = iVar136;
      auVar40._8_4_ = iVar135;
      auVar40._12_4_ = iVar135;
      auVar81 = pshufhw(auVar84,auVar40,0x84);
      auVar122 = pshufhw(auVar106,auVar141,0x84);
      auVar74._8_4_ = 0xffffffff;
      auVar74._0_8_ = 0xffffffffffffffff;
      auVar74._12_4_ = 0xffffffff;
      auVar74 = (auVar122 | auVar81 & auVar106) ^ auVar74;
      auVar106 = packssdw(auVar74,auVar74);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106._6_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar51 + 0x1c + uVar50 * 4) = 1;
      }
      auVar106 = (auVar102 | auVar80) ^ auVar47;
      auVar85._0_4_ = -(uint)(iVar54 < auVar106._0_4_);
      auVar85._4_4_ = -(uint)(iVar67 < auVar106._4_4_);
      auVar85._8_4_ = -(uint)(iVar69 < auVar106._8_4_);
      auVar85._12_4_ = -(uint)(iVar108 < auVar106._12_4_);
      auVar41._4_4_ = auVar85._0_4_;
      auVar41._0_4_ = auVar85._0_4_;
      auVar41._8_4_ = auVar85._8_4_;
      auVar41._12_4_ = auVar85._8_4_;
      auVar81 = pshuflw(auVar141,auVar41,0xe8);
      auVar75._0_4_ = -(uint)(auVar106._0_4_ == iVar54);
      auVar75._4_4_ = -(uint)(auVar106._4_4_ == iVar67);
      auVar75._8_4_ = -(uint)(auVar106._8_4_ == iVar69);
      auVar75._12_4_ = -(uint)(auVar106._12_4_ == iVar108);
      auVar129._4_4_ = auVar75._4_4_;
      auVar129._0_4_ = auVar75._4_4_;
      auVar129._8_4_ = auVar75._12_4_;
      auVar129._12_4_ = auVar75._12_4_;
      auVar106 = pshuflw(auVar75,auVar129,0xe8);
      auVar130._4_4_ = auVar85._4_4_;
      auVar130._0_4_ = auVar85._4_4_;
      auVar130._8_4_ = auVar85._12_4_;
      auVar130._12_4_ = auVar85._12_4_;
      auVar122 = pshuflw(auVar85,auVar130,0xe8);
      auVar86._8_4_ = 0xffffffff;
      auVar86._0_8_ = 0xffffffffffffffff;
      auVar86._12_4_ = 0xffffffff;
      auVar86 = (auVar122 | auVar106 & auVar81) ^ auVar86;
      auVar122 = packssdw(auVar86,auVar86);
      auVar106 = packsswb(auVar106 & auVar81,auVar122);
      if ((auVar106 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar51 + 0x20 + uVar50 * 4) = 1;
      }
      auVar42._4_4_ = auVar85._0_4_;
      auVar42._0_4_ = auVar85._0_4_;
      auVar42._8_4_ = auVar85._8_4_;
      auVar42._12_4_ = auVar85._8_4_;
      auVar130 = auVar129 & auVar42 | auVar130;
      auVar122 = packssdw(auVar130,auVar130);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar122 = packssdw(auVar122 ^ auVar15,auVar122 ^ auVar15);
      auVar106 = packsswb(auVar106,auVar122);
      if ((auVar106._8_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar51 + 0x24 + uVar50 * 4) = 1;
      }
      auVar106 = (auVar102 | auVar70) ^ auVar47;
      auVar87._0_4_ = -(uint)(iVar54 < auVar106._0_4_);
      auVar87._4_4_ = -(uint)(iVar67 < auVar106._4_4_);
      auVar87._8_4_ = -(uint)(iVar69 < auVar106._8_4_);
      auVar87._12_4_ = -(uint)(iVar108 < auVar106._12_4_);
      auVar131._4_4_ = auVar87._0_4_;
      auVar131._0_4_ = auVar87._0_4_;
      auVar131._8_4_ = auVar87._8_4_;
      auVar131._12_4_ = auVar87._8_4_;
      iVar136 = -(uint)(auVar106._4_4_ == iVar67);
      iVar135 = -(uint)(auVar106._12_4_ == iVar108);
      auVar43._4_4_ = iVar136;
      auVar43._0_4_ = iVar136;
      auVar43._8_4_ = iVar135;
      auVar43._12_4_ = iVar135;
      auVar142._4_4_ = auVar87._4_4_;
      auVar142._0_4_ = auVar87._4_4_;
      auVar142._8_4_ = auVar87._12_4_;
      auVar142._12_4_ = auVar87._12_4_;
      auVar106 = auVar43 & auVar131 | auVar142;
      auVar106 = packssdw(auVar106,auVar106);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar106 = packssdw(auVar106 ^ auVar16,auVar106 ^ auVar16);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar51 + 0x28 + uVar50 * 4) = 1;
      }
      auVar106 = pshufhw(auVar106,auVar131,0x84);
      auVar44._4_4_ = iVar136;
      auVar44._0_4_ = iVar136;
      auVar44._8_4_ = iVar135;
      auVar44._12_4_ = iVar135;
      auVar81 = pshufhw(auVar87,auVar44,0x84);
      auVar122 = pshufhw(auVar106,auVar142,0x84);
      auVar76._8_4_ = 0xffffffff;
      auVar76._0_8_ = 0xffffffffffffffff;
      auVar76._12_4_ = 0xffffffff;
      auVar76 = (auVar122 | auVar81 & auVar106) ^ auVar76;
      auVar106 = packssdw(auVar76,auVar76);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106._10_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar51 + 0x2c + uVar50 * 4) = 1;
      }
      auVar106 = (auVar102 | _DAT_001d9cc0) ^ auVar47;
      auVar88._0_4_ = -(uint)(iVar54 < auVar106._0_4_);
      auVar88._4_4_ = -(uint)(iVar67 < auVar106._4_4_);
      auVar88._8_4_ = -(uint)(iVar69 < auVar106._8_4_);
      auVar88._12_4_ = -(uint)(iVar108 < auVar106._12_4_);
      auVar45._4_4_ = auVar88._0_4_;
      auVar45._0_4_ = auVar88._0_4_;
      auVar45._8_4_ = auVar88._8_4_;
      auVar45._12_4_ = auVar88._8_4_;
      auVar81 = pshuflw(auVar142,auVar45,0xe8);
      auVar77._0_4_ = -(uint)(auVar106._0_4_ == iVar54);
      auVar77._4_4_ = -(uint)(auVar106._4_4_ == iVar67);
      auVar77._8_4_ = -(uint)(auVar106._8_4_ == iVar69);
      auVar77._12_4_ = -(uint)(auVar106._12_4_ == iVar108);
      auVar132._4_4_ = auVar77._4_4_;
      auVar132._0_4_ = auVar77._4_4_;
      auVar132._8_4_ = auVar77._12_4_;
      auVar132._12_4_ = auVar77._12_4_;
      auVar106 = pshuflw(auVar77,auVar132,0xe8);
      auVar133._4_4_ = auVar88._4_4_;
      auVar133._0_4_ = auVar88._4_4_;
      auVar133._8_4_ = auVar88._12_4_;
      auVar133._12_4_ = auVar88._12_4_;
      auVar122 = pshuflw(auVar88,auVar133,0xe8);
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      auVar106 = packssdw(auVar106 & auVar81,(auVar122 | auVar106 & auVar81) ^ auVar17);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar51 + 0x30 + uVar50 * 4) = 1;
      }
      auVar46._4_4_ = auVar88._0_4_;
      auVar46._0_4_ = auVar88._0_4_;
      auVar46._8_4_ = auVar88._8_4_;
      auVar46._12_4_ = auVar88._8_4_;
      auVar133 = auVar132 & auVar46 | auVar133;
      auVar122 = packssdw(auVar133,auVar133);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar106 = packssdw(auVar106,auVar122 ^ auVar18);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106._12_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar51 + 0x34 + uVar50 * 4) = 1;
      }
      auVar106 = (auVar102 | _DAT_001d9cb0) ^ auVar47;
      auVar78._0_4_ = -(uint)(iVar54 < auVar106._0_4_);
      auVar78._4_4_ = -(uint)(iVar67 < auVar106._4_4_);
      auVar78._8_4_ = -(uint)(iVar69 < auVar106._8_4_);
      auVar78._12_4_ = -(uint)(iVar108 < auVar106._12_4_);
      auVar134._4_4_ = auVar78._0_4_;
      auVar134._0_4_ = auVar78._0_4_;
      auVar134._8_4_ = auVar78._8_4_;
      auVar134._12_4_ = auVar78._8_4_;
      auVar103._4_4_ = -(uint)(auVar106._4_4_ == iVar67);
      auVar103._12_4_ = -(uint)(auVar106._12_4_ == iVar108);
      auVar103._0_4_ = auVar103._4_4_;
      auVar103._8_4_ = auVar103._12_4_;
      auVar107._4_4_ = auVar78._4_4_;
      auVar107._0_4_ = auVar78._4_4_;
      auVar107._8_4_ = auVar78._12_4_;
      auVar107._12_4_ = auVar78._12_4_;
      auVar122 = auVar103 & auVar134 | auVar107;
      auVar106 = packssdw(auVar78,auVar122);
      auVar19._8_4_ = 0xffffffff;
      auVar19._0_8_ = 0xffffffffffffffff;
      auVar19._12_4_ = 0xffffffff;
      auVar106 = packssdw(auVar106 ^ auVar19,auVar106 ^ auVar19);
      auVar106 = packsswb(auVar106,auVar106);
      if ((auVar106 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(lVar51 + 0x38 + uVar50 * 4) = 1;
      }
      auVar106 = pshufhw(auVar106,auVar134,0x84);
      in_XMM2 = pshufhw(auVar122,auVar103,0x84);
      in_XMM2 = in_XMM2 & auVar106;
      auVar106 = pshufhw(auVar106,auVar107,0x84);
      auVar79._8_4_ = 0xffffffff;
      auVar79._0_8_ = 0xffffffffffffffff;
      auVar79._12_4_ = 0xffffffff;
      auVar79 = (auVar106 | in_XMM2) ^ auVar79;
      auVar106 = packssdw(auVar79,auVar79);
      in_XMM1 = packsswb(auVar106,auVar106);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *(undefined1 *)(lVar51 + 0x3c + uVar50 * 4) = 1;
      }
      uVar50 = uVar50 + 0x10;
    } while ((lVar52 + 0xfU & 0xfffffffffffffff0) != uVar50);
  }
  return;
}

Assistant:

void CEditor::DoMapBorder()
{
	CLayerTiles *pT = (CLayerTiles *)GetSelectedLayerType(0, LAYERTYPE_TILES);

	for(int i = 0; i < pT->m_Width*2; ++i)
		pT->m_pTiles[i].m_Index = 1;

	for(int i = 0; i < pT->m_Width*pT->m_Height; ++i)
	{
		if(i%pT->m_Width < 2 || i%pT->m_Width > pT->m_Width-3)
			pT->m_pTiles[i].m_Index = 1;
	}

	for(int i = (pT->m_Width*(pT->m_Height-2)); i < pT->m_Width*pT->m_Height; ++i)
		pT->m_pTiles[i].m_Index = 1;
}